

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.hpp
# Opt level: O1

void njoy::tools::disco::Character<66u>::
     write<std::__cxx11::string,std::back_insert_iterator<std::__cxx11::string>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = value->_M_string_length;
  iVar3 = (int)uVar1 + -0x42;
  uVar2 = 0;
  if (iVar3 != 0 && uVar1 < 0x42) {
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      std::__cxx11::string::push_back((char)iter->container);
      if (0x41 < uVar1) break;
    } while (uVar2 < (uint)-iVar3);
  }
  if (uVar2 < 0x42) {
    iVar3 = 0;
    do {
      std::__cxx11::string::push_back((char)iter->container);
      iVar3 = iVar3 + 1;
    } while (0x42 - uVar2 != iVar3);
  }
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    unsigned int position = 0;
    const unsigned int difference = value.size() >= Width ? 0 : Width - value.size();
    while ( position < difference ) {

      ++position;
      *iter++ = ' ';
    }
    auto viter = value.begin();
    while ( position < Width ) {

      ++position;
      *iter++ = *viter++;
    }
  }